

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O2

void linenoise_completion(char *zLine,linenoiseCompletions *lc)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  uchar *__src;
  ulong uVar5;
  sqlite3 *db;
  size_t line_idx;
  long lVar6;
  bool bVar7;
  uint uVar8;
  sqlite3_stmt *pStmt;
  char *local_430;
  linenoiseCompletions *local_428;
  sqlite3 *localDb;
  char zBuf [1000];
  
  local_430 = zLine;
  local_428 = lc;
  sVar3 = strlen(zLine);
  pStmt = (sqlite3_stmt *)0x0;
  if ((sVar3 < 0x3cb) && (*local_430 != '#')) {
    if (*local_430 == '.') {
      for (lVar6 = 0; lVar6 != 0x76; lVar6 = lVar6 + 1) {
        pcVar4 = azHelp[lVar6];
        if (*pcVar4 == '.') {
          uVar8 = 0x2e;
          uVar5 = 0;
          while( true ) {
            iVar1 = isspace(uVar8);
            if (((char)uVar8 == '\0') || (iVar1 != 0)) goto LAB_001e89d7;
            if (uVar5 == 999) break;
            zBuf[uVar5] = (char)uVar8;
            if ((uVar5 < sVar3) && (pcVar4[uVar5] != local_430[uVar5])) {
              zBuf[uVar5] = '\0';
              goto LAB_001e8a05;
            }
            uVar8 = (uint)(byte)pcVar4[uVar5 + 1];
            uVar5 = uVar5 + 1;
          }
          uVar5 = 999;
LAB_001e89d7:
          zBuf[uVar5] = '\0';
          if (sVar3 <= uVar5) {
            linenoiseAddCompletion(local_428,zBuf);
          }
        }
LAB_001e8a05:
      }
    }
    else {
      pcVar4 = duckdb_shell_sqlite3_mprintf("CALL sql_auto_complete(%Q)",local_430);
      localDb = (sqlite3 *)0x0;
      db = globalDb;
      if (globalDb == (sqlite3 *)0x0) {
        duckdb_shell_sqlite3_open(":memory:",&localDb);
        db = localDb;
      }
      duckdb_shell_sqlite3_prepare_v2(db,pcVar4,-1,&pStmt,(char **)0x0);
      duckdb_shell_sqlite3_free(pcVar4);
      bVar7 = true;
      while( true ) {
        iVar1 = duckdb_shell_sqlite3_step(pStmt);
        if (iVar1 != 100) break;
        __src = duckdb_shell_sqlite3_column_text(pStmt,0);
        iVar1 = duckdb_shell_sqlite3_column_bytes(pStmt,0);
        iVar2 = duckdb_shell_sqlite3_column_int(pStmt,1);
        if (iVar2 + iVar1 < 999) {
          if (bVar7) {
            switchD_00917c1c::default(zBuf,local_430,(long)iVar2);
          }
          switchD_00917c1c::default(zBuf + iVar2,__src,(long)(iVar1 + 1));
          linenoiseAddCompletion(local_428,zBuf);
          bVar7 = false;
        }
      }
      duckdb_shell_sqlite3_finalize(pStmt);
      if (localDb != (sqlite3 *)0x0) {
        duckdb_shell_sqlite3_close(localDb);
      }
    }
  }
  return;
}

Assistant:

static void linenoise_completion(const char *zLine, linenoiseCompletions *lc) {
	idx_t nLine = ShellState::StringLength(zLine);
	int copiedSuggestion = 0;
	sqlite3_stmt *pStmt = 0;
	char *zSql;
	char zBuf[1000];

	if (nLine > sizeof(zBuf) - 30) {
		return;
	}
	if (zLine[0] == '.') {
		// auto-complete dot command
		// look for all completions in the help file
		size_t line_idx;
		for (line_idx = 0; line_idx < ArraySize(azHelp); line_idx++) {
			const char *line = azHelp[line_idx];
			if (line[0] != '.') {
				continue;
			}
			int found_match = 1;
			size_t line_pos;
			for (line_pos = 0; !IsSpace(line[line_pos]) && line[line_pos] && line_pos + 1 < sizeof(zBuf); line_pos++) {
				zBuf[line_pos] = line[line_pos];
				if (line_pos < nLine && line[line_pos] != zLine[line_pos]) {
					// only match prefixes for auto-completion, i.e. ".sh" matches ".shell"
					found_match = 0;
					break;
				}
			}
			zBuf[line_pos] = '\0';
			if (found_match && line_pos >= nLine) {
				linenoiseAddCompletion(lc, zBuf);
			}
		}
		return;
	}
	if (zLine[0] == '#') {
		return;
	}
	//  if( i==nLine-1 ) return;
	zSql = sqlite3_mprintf("CALL sql_auto_complete(%Q)", zLine);
	sqlite3 *localDb = NULL;
	if (!globalDb) {
		sqlite3_open(":memory:", &localDb);
		sqlite3_prepare_v2(localDb, zSql, -1, &pStmt, 0);
	} else {
		sqlite3_prepare_v2(globalDb, zSql, -1, &pStmt, 0);
	}
	sqlite3_free(zSql);
	while (sqlite3_step(pStmt) == SQLITE_ROW) {
		const char *zCompletion = (const char *)sqlite3_column_text(pStmt, 0);
		int nCompletion = sqlite3_column_bytes(pStmt, 0);
		int iStart = sqlite3_column_int(pStmt, 1);
		if (iStart + nCompletion < int(sizeof(zBuf) - 1)) {
			if (!copiedSuggestion) {
				memcpy(zBuf, zLine, iStart);
				copiedSuggestion = 1;
			}
			memcpy(zBuf + iStart, zCompletion, nCompletion + 1);
			linenoiseAddCompletion(lc, zBuf);
		}
	}
	sqlite3_finalize(pStmt);
	if (localDb) {
		sqlite3_close(localDb);
	}
}